

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

enable_if_t<HasSize<vector<pair<basic_string<char>,_SceneEntity>_>_>::value_&&_HasData<vector<pair<basic_string<char>,_SceneEntity>_>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
           *v)

{
  ulong uVar1;
  pointer v_00;
  string ret;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  v_00 = (v->
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if ((v->
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != v_00) {
    uVar1 = 0;
    do {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      stringPrintfRecursive<std::__cxx11::string_const&,pbrt::SceneEntity_const&>
                (&local_50,"[ std::pair first: %s second: %s ]",&v_00->first,&v_00->second);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_50._M_dataplus._M_p,local_50._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if (uVar1 < ((long)(v->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(v->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 6) * -0x5555555555555555 - 1U
         ) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      uVar1 = uVar1 + 1;
      v_00 = v_00 + 1;
    } while (uVar1 < (ulong)(((long)(v->
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(v->
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 6) *
                            -0x5555555555555555));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return os;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}